

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bitileave.cpp
# Opt level: O1

void __thiscall
bitmanip::anon_unknown_0::Test_bitileave_remIleavedBits_const_manual_::run
          (Test_bitileave_remIleavedBits_const_manual_ *this)

{
  string_view msg;
  string_view msg_00;
  string_view msg_01;
  string_view msg_02;
  string_view msg_03;
  string_view msg_04;
  SourceLocation loc;
  SourceLocation loc_00;
  SourceLocation loc_01;
  SourceLocation loc_02;
  SourceLocation loc_03;
  SourceLocation loc_04;
  size_t i;
  long lVar1;
  long *plVar2;
  long *plVar3;
  size_type *psVar4;
  long *plVar5;
  ulong uVar6;
  ulong uVar7;
  size_t in_stack_fffffffffffffe70;
  ulong uStack_180;
  long local_178;
  long lStack_170;
  undefined8 local_168;
  undefined8 uVar8;
  uint uVar9;
  undefined4 in_stack_fffffffffffffeac;
  undefined4 uVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  string local_128;
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  char *local_a8;
  char *pcStack_a0;
  undefined8 local_98;
  char *local_90;
  char *pcStack_88;
  undefined8 local_80;
  char *local_78;
  char *pcStack_70;
  undefined8 local_68;
  char *local_60;
  char *pcStack_58;
  undefined8 local_50;
  char *local_48;
  char *pcStack_40;
  undefined8 local_38;
  char *local_30;
  char *pcStack_28;
  undefined8 local_20;
  
  uVar7 = 0x5555555555555555;
  uStack_180 = 0x3333333333333333;
  local_178 = 0xf0f0f0f0f0f0f0f;
  lStack_170 = 0xff00ff00ff00ff;
  local_168 = 0xffff0000ffff;
  uVar8 = 0xffffffff;
  uVar6 = 0x55;
  lVar1 = 0;
  do {
    uVar6 = (uVar6 | uVar6 >> ((byte)(1 << ((byte)lVar1 & 0x1f)) & 0x3f)) & (&uStack_180)[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  uVar9 = 0xf;
  if (uVar6 != 0xf) {
    detail::stringify_impl<unsigned_long>(&local_108,(unsigned_long *)&stack0xfffffffffffffeb0);
    std::operator+(&local_e8,
                   "Comparison failed: remIleavedBits_const<1>(0xff) == 0xfu (with \"remIleavedBits_const<1>(0xff)\"="
                   ,&local_108);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_e8);
    local_148._M_dataplus._M_p = (pointer)*plVar2;
    psVar4 = (size_type *)(plVar2 + 2);
    if ((size_type *)local_148._M_dataplus._M_p == psVar4) {
      local_148.field_2._M_allocated_capacity = *psVar4;
      local_148.field_2._8_8_ = plVar2[3];
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    }
    else {
      local_148.field_2._M_allocated_capacity = *psVar4;
    }
    local_148._M_string_length = plVar2[1];
    *plVar2 = (long)psVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    detail::stringify_impl<unsigned_int>(&local_128,(uint *)&stack0xfffffffffffffea8);
    std::operator+(&local_c8,&local_148,&local_128);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_c8);
    plVar2 = (long *)*plVar3;
    plVar5 = plVar3 + 2;
    if (plVar2 == plVar5) {
      local_178 = *plVar5;
      lStack_170 = plVar3[3];
      plVar2 = &local_178;
    }
    else {
      local_178 = *plVar5;
    }
    uStack_180 = plVar3[1];
    *plVar3 = (long)plVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    local_30 = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
    ;
    pcStack_28 = "run";
    local_20 = 0x5c;
    msg._M_str = (char *)plVar2;
    msg._M_len = in_stack_fffffffffffffe70;
    loc.function._0_4_ = uVar9;
    loc.file = (char *)uVar8;
    loc.function._4_4_ = in_stack_fffffffffffffeac;
    loc.line = uVar6;
    assertFail(msg,loc);
  }
  uStack_180 = 0x3333333333333333;
  local_178 = 0xf0f0f0f0f0f0f0f;
  lStack_170 = 0xff00ff00ff00ff;
  local_168 = 0xffff0000ffff;
  uVar8 = 0xffffffff;
  uVar6 = 0x55;
  lVar1 = 0;
  do {
    uVar6 = (uVar6 | uVar6 >> ((byte)(1 << ((byte)lVar1 & 0x1f)) & 0x3f)) & (&uStack_180)[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  uVar9 = 0xf;
  if (uVar6 != 0xf) {
    detail::stringify_impl<unsigned_long>(&local_108,(unsigned_long *)&stack0xfffffffffffffeb0);
    std::operator+(&local_e8,
                   "Comparison failed: remIleavedBits_const<1>(0b01010101) == 0b1111u (with \"remIleavedBits_const<1>(0b01010101)\"="
                   ,&local_108);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_e8);
    local_148._M_dataplus._M_p = (pointer)*plVar2;
    psVar4 = (size_type *)(plVar2 + 2);
    if ((size_type *)local_148._M_dataplus._M_p == psVar4) {
      local_148.field_2._M_allocated_capacity = *psVar4;
      local_148.field_2._8_8_ = plVar2[3];
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    }
    else {
      local_148.field_2._M_allocated_capacity = *psVar4;
    }
    local_148._M_string_length = plVar2[1];
    *plVar2 = (long)psVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    detail::stringify_impl<unsigned_int>(&local_128,(uint *)&stack0xfffffffffffffea8);
    std::operator+(&local_c8,&local_148,&local_128);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_c8);
    plVar2 = (long *)*plVar3;
    plVar5 = plVar3 + 2;
    if (plVar2 == plVar5) {
      local_178 = *plVar5;
      lStack_170 = plVar3[3];
      plVar2 = &local_178;
    }
    else {
      local_178 = *plVar5;
    }
    uStack_180 = plVar3[1];
    *plVar3 = (long)plVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    local_48 = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
    ;
    pcStack_40 = "run";
    local_38 = 0x5d;
    msg_00._M_str = (char *)plVar2;
    msg_00._M_len = in_stack_fffffffffffffe70;
    loc_00.function._0_4_ = uVar9;
    loc_00.file = (char *)uVar8;
    loc_00.function._4_4_ = in_stack_fffffffffffffeac;
    loc_00.line = uVar6;
    assertFail(msg_00,loc_00);
  }
  uStack_180 = 0x3333333333333333;
  local_178 = 0xf0f0f0f0f0f0f0f;
  lStack_170 = 0xff00ff00ff00ff;
  local_168 = 0xffff0000ffff;
  uVar8 = 0xffffffff;
  lVar1 = 0;
  do {
    uVar7 = (uVar7 | uVar7 >> ((byte)(1 << ((byte)lVar1 & 0x1f)) & 0x3f)) & (&uStack_180)[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  uVar9 = 0xffffffff;
  if (uVar7 != 0xffffffff) {
    detail::stringify_impl<unsigned_long>(&local_108,(unsigned_long *)&stack0xfffffffffffffeb0);
    std::operator+(&local_e8,
                   "Comparison failed: remIleavedBits_const<1>(0x5555\'5555\'5555\'5555) == 0xffff\'ffffu (with \"remIleavedBits_const<1>(0x5555\'5555\'5555\'5555)\"="
                   ,&local_108);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_e8);
    local_148._M_dataplus._M_p = (pointer)*plVar2;
    psVar4 = (size_type *)(plVar2 + 2);
    if ((size_type *)local_148._M_dataplus._M_p == psVar4) {
      local_148.field_2._M_allocated_capacity = *psVar4;
      local_148.field_2._8_8_ = plVar2[3];
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    }
    else {
      local_148.field_2._M_allocated_capacity = *psVar4;
    }
    local_148._M_string_length = plVar2[1];
    *plVar2 = (long)psVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    detail::stringify_impl<unsigned_int>(&local_128,(uint *)&stack0xfffffffffffffea8);
    std::operator+(&local_c8,&local_148,&local_128);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_c8);
    plVar2 = (long *)*plVar3;
    plVar5 = plVar3 + 2;
    if (plVar2 == plVar5) {
      local_178 = *plVar5;
      lStack_170 = plVar3[3];
      plVar2 = &local_178;
    }
    else {
      local_178 = *plVar5;
    }
    uStack_180 = plVar3[1];
    *plVar3 = (long)plVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    local_60 = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
    ;
    pcStack_58 = "run";
    local_50 = 0x5e;
    msg_01._M_str = (char *)plVar2;
    msg_01._M_len = in_stack_fffffffffffffe70;
    loc_01.function._0_4_ = uVar9;
    loc_01.file = (char *)uVar8;
    loc_01.function._4_4_ = in_stack_fffffffffffffeac;
    loc_01.line = uVar7;
    assertFail(msg_01,loc_01);
  }
  uVar6 = 0x1111111111111111;
  uStack_180 = 0x303030303030303;
  local_178 = 0xf000f000f000f;
  lStack_170 = 0xff000000ff;
  local_168 = 0xffff;
  uVar8 = 0xffffffff;
  lVar1 = 0;
  do {
    uVar6 = (uVar6 | uVar6 >> ((byte)(3 << ((byte)lVar1 & 0x1f)) & 0x3f)) & (&uStack_180)[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  uVar9 = 0xffff;
  if (uVar6 == 0xffff) {
    uStack_180 = 0x300c0300c0300c03;
    local_178 = 0xf0000f0000f0000f;
    lStack_170 = 0xff00000000ff;
    local_168 = 0xffff;
    uVar8 = 0xffffffff;
    uVar6 = 0x100000;
    lVar1 = 0;
    do {
      uVar6 = (uVar6 | uVar6 >> ((byte)(4 << ((byte)lVar1 & 0x1f)) & 0x3f)) & (&uStack_180)[lVar1];
      lVar1 = lVar1 + 1;
    } while (lVar1 != 4);
    uVar9 = 0x10;
    uVar10 = 0;
    if (uVar6 != 0x10) {
      detail::stringify_impl<unsigned_long>(&local_108,(unsigned_long *)&stack0xfffffffffffffeb0);
      std::operator+(&local_e8,
                     "Comparison failed: remIleavedBits_const<4>(12345678) == detail::remIleavedBits_naive(12345678, 4) (with \"remIleavedBits_const<4>(12345678)\"="
                     ,&local_108);
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_e8);
      local_148._M_dataplus._M_p = (pointer)*plVar2;
      psVar4 = (size_type *)(plVar2 + 2);
      if ((size_type *)local_148._M_dataplus._M_p == psVar4) {
        local_148.field_2._M_allocated_capacity = *psVar4;
        local_148.field_2._8_8_ = plVar2[3];
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      }
      else {
        local_148.field_2._M_allocated_capacity = *psVar4;
      }
      local_148._M_string_length = plVar2[1];
      *plVar2 = (long)psVar4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      detail::stringify_impl<unsigned_long>(&local_128,(unsigned_long *)&stack0xfffffffffffffea8);
      std::operator+(&local_c8,&local_148,&local_128);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_c8);
      plVar2 = (long *)*plVar3;
      plVar5 = plVar3 + 2;
      if (plVar2 == plVar5) {
        local_178 = *plVar5;
        lStack_170 = plVar3[3];
        plVar2 = &local_178;
      }
      else {
        local_178 = *plVar5;
      }
      uStack_180 = plVar3[1];
      *plVar3 = (long)plVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      local_90 = 
      "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
      ;
      pcStack_88 = "run";
      local_80 = 0x61;
      msg_03._M_str = (char *)plVar2;
      msg_03._M_len = in_stack_fffffffffffffe70;
      loc_03.function._0_4_ = uVar9;
      loc_03.file = (char *)uVar8;
      loc_03.function._4_4_ = uVar10;
      loc_03.line = uVar6;
      assertFail(msg_03,loc_03);
    }
    uStack_180 = 0xc00030000c0003;
    local_178 = 0xf00000000f;
    lStack_170 = 0xff;
    local_168 = 0xffff;
    uVar8 = 0xffffffff;
    uVar6 = 0x40000;
    lVar1 = 0;
    do {
      uVar6 = (uVar6 | uVar6 >> ((byte)(8 << ((byte)lVar1 & 0x1f)) & 0x3f)) & (&uStack_180)[lVar1];
      lVar1 = lVar1 + 1;
    } while (lVar1 != 3);
    uVar9 = 4;
    uVar10 = 0;
    if (uVar6 == 4) {
      return;
    }
    detail::stringify_impl<unsigned_long>(&local_108,(unsigned_long *)&stack0xfffffffffffffeb0);
    std::operator+(&local_e8,
                   "Comparison failed: remIleavedBits_const<8>(12345678) == detail::remIleavedBits_naive(12345678, 8) (with \"remIleavedBits_const<8>(12345678)\"="
                   ,&local_108);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_e8);
    local_148._M_dataplus._M_p = (pointer)*plVar2;
    psVar4 = (size_type *)(plVar2 + 2);
    if ((size_type *)local_148._M_dataplus._M_p == psVar4) {
      local_148.field_2._M_allocated_capacity = *psVar4;
      local_148.field_2._8_8_ = plVar2[3];
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    }
    else {
      local_148.field_2._M_allocated_capacity = *psVar4;
    }
    local_148._M_string_length = plVar2[1];
    *plVar2 = (long)psVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    detail::stringify_impl<unsigned_long>(&local_128,(unsigned_long *)&stack0xfffffffffffffea8);
    std::operator+(&local_c8,&local_148,&local_128);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_c8);
    plVar2 = (long *)*plVar3;
    plVar5 = plVar3 + 2;
    if (plVar2 == plVar5) {
      local_178 = *plVar5;
      lStack_170 = plVar3[3];
      plVar2 = &local_178;
    }
    else {
      local_178 = *plVar5;
    }
    uStack_180 = plVar3[1];
    *plVar3 = (long)plVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    local_a8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
    ;
    pcStack_a0 = "run";
    local_98 = 0x62;
    msg_04._M_str = (char *)plVar2;
    msg_04._M_len = in_stack_fffffffffffffe70;
    loc_04.function._0_4_ = uVar9;
    loc_04.file = (char *)uVar8;
    loc_04.function._4_4_ = uVar10;
    loc_04.line = uVar6;
    assertFail(msg_04,loc_04);
  }
  detail::stringify_impl<unsigned_long>(&local_108,(unsigned_long *)&stack0xfffffffffffffeb0);
  std::operator+(&local_e8,
                 "Comparison failed: remIleavedBits_const<3>(0x1111\'1111\'1111\'1111) == 0b1111\'1111\'1111\'1111u (with \"remIleavedBits_const<3>(0x1111\'1111\'1111\'1111)\"="
                 ,&local_108);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_e8);
  local_148._M_dataplus._M_p = (pointer)*plVar2;
  psVar4 = (size_type *)(plVar2 + 2);
  if ((size_type *)local_148._M_dataplus._M_p == psVar4) {
    local_148.field_2._M_allocated_capacity = *psVar4;
    local_148.field_2._8_8_ = plVar2[3];
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  }
  else {
    local_148.field_2._M_allocated_capacity = *psVar4;
  }
  local_148._M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  detail::stringify_impl<unsigned_int>(&local_128,(uint *)&stack0xfffffffffffffea8);
  std::operator+(&local_c8,&local_148,&local_128);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_c8);
  plVar2 = (long *)*plVar3;
  plVar5 = plVar3 + 2;
  if (plVar2 == plVar5) {
    local_178 = *plVar5;
    lStack_170 = plVar3[3];
    plVar2 = &local_178;
  }
  else {
    local_178 = *plVar5;
  }
  uStack_180 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  local_78 = 
  "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp";
  pcStack_70 = "run";
  local_68 = 0x5f;
  msg_02._M_str = (char *)plVar2;
  msg_02._M_len = in_stack_fffffffffffffe70;
  loc_02.function._0_4_ = uVar9;
  loc_02.file = (char *)uVar8;
  loc_02.function._4_4_ = in_stack_fffffffffffffeac;
  loc_02.line = uVar6;
  assertFail(msg_02,loc_02);
}

Assistant:

BITMANIP_TEST(bitileave, remIleavedBits_const_manual)
{
    BITMANIP_STATIC_ASSERT_EQ(remIleavedBits_const<0>(0xff), 0xffu);
    BITMANIP_STATIC_ASSERT_EQ(remIleavedBits_const<1>(0xff), 0xfu);
    BITMANIP_STATIC_ASSERT_EQ(remIleavedBits_const<1>(0b01010101), 0b1111u);
    BITMANIP_STATIC_ASSERT_EQ(remIleavedBits_const<1>(0x5555'5555'5555'5555), 0xffff'ffffu);
    BITMANIP_STATIC_ASSERT_EQ(remIleavedBits_const<3>(0x1111'1111'1111'1111), 0b1111'1111'1111'1111u);

    BITMANIP_STATIC_ASSERT_EQ(remIleavedBits_const<4>(12345678), detail::remIleavedBits_naive(12345678, 4));
    BITMANIP_STATIC_ASSERT_EQ(remIleavedBits_const<8>(12345678), detail::remIleavedBits_naive(12345678, 8));
    BITMANIP_STATIC_ASSERT_EQ(remIleavedBits_const<16>(12345678), detail::remIleavedBits_naive(12345678, 16));
    BITMANIP_STATIC_ASSERT_EQ(remIleavedBits_const<32>(12345678), detail::remIleavedBits_naive(12345678, 32));
    BITMANIP_STATIC_ASSERT_EQ(remIleavedBits_const<63>(12345678), detail::remIleavedBits_naive(12345678, 63));
    BITMANIP_STATIC_ASSERT_EQ(remIleavedBits_const<64>(12345678), detail::remIleavedBits_naive(12345678, 64));
}